

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace-type-from-pseudo-trace-type.cpp
# Opt level: O0

unique_ptr<const_yactfr::DataStreamType,_std::default_delete<const_yactfr::DataStreamType>_>
__thiscall
yactfr::internal::TraceTypeFromPseudoTraceTypeConverter::_dstFromPseudoDst
          (TraceTypeFromPseudoTraceTypeConverter *this,PseudoDst *pseudoDst)

{
  bool bVar1;
  PseudoOrphanErts *pPVar2;
  pointer ppVar3;
  reference ppPVar4;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *args_2
  ;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *args_3
  ;
  set<std::unique_ptr<const_yactfr::EventRecordType,_std::default_delete<const_yactfr::EventRecordType>_>,_yactfr::internal::ErtIdComp,_std::allocator<std::unique_ptr<const_yactfr::EventRecordType,_std::default_delete<const_yactfr::EventRecordType>_>_>_>
  *args_4;
  PseudoDt *pPVar5;
  PseudoErt *in_RDX;
  pair<std::__detail::_Node_iterator<yactfr::internal::PseudoErt_*,_true,_false>,_bool> pVar6;
  pair<std::_Rb_tree_const_iterator<std::unique_ptr<const_yactfr::EventRecordType,_std::default_delete<const_yactfr::EventRecordType>_>_>,_bool>
  pVar7;
  undefined1 local_150 [8];
  __uniq_ptr_impl<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> local_148;
  undefined1 local_140 [16];
  undefined1 local_130 [16];
  _Base_ptr local_120;
  undefined1 local_118;
  TraceTypeFromPseudoTraceTypeConverter local_110;
  PseudoErt *pseudoErt;
  iterator __end2;
  iterator __begin2;
  PseudoErtSet *__range2;
  EventRecordTypeSet ertSet;
  PseudoErt *local_a8;
  reference local_a0;
  pair<const_unsigned_long_long,_yactfr::internal::PseudoOrphanErt> *ertIdPseudoOrphanErtPair;
  iterator __end3;
  iterator __begin3;
  unordered_map<unsigned_long_long,_yactfr::internal::PseudoOrphanErt,_std::hash<unsigned_long_long>,_std::equal_to<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_yactfr::internal::PseudoOrphanErt>_>_>
  *__range3;
  TypeId local_68;
  _Node_iterator_base<std::pair<const_unsigned_long_long,_std::unordered_map<unsigned_long_long,_yactfr::internal::PseudoOrphanErt,_std::hash<unsigned_long_long>,_std::equal_to<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_yactfr::internal::PseudoOrphanErt>_>_>_>,_false>
  local_60;
  iterator it;
  PseudoErtSet pseudoErts;
  PseudoDst *pseudoDst_local;
  TraceTypeFromPseudoTraceTypeConverter *this_local;
  
  std::
  unordered_set<yactfr::internal::PseudoErt_*,_std::hash<yactfr::internal::PseudoErt_*>,_std::equal_to<yactfr::internal::PseudoErt_*>,_std::allocator<yactfr::internal::PseudoErt_*>_>
  ::unordered_set((unordered_set<yactfr::internal::PseudoErt_*,_std::hash<yactfr::internal::PseudoErt_*>,_std::equal_to<yactfr::internal::PseudoErt_*>,_std::allocator<yactfr::internal::PseudoErt_*>_>
                   *)&it);
  pPVar2 = PseudoTraceType::pseudoOrphanErts((PseudoTraceType *)pseudoDst->_id);
  local_68 = PseudoDst::id((PseudoDst *)in_RDX);
  local_60._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long_long,_std::unordered_map<unsigned_long_long,_yactfr::internal::PseudoOrphanErt,_std::hash<unsigned_long_long>,_std::equal_to<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_yactfr::internal::PseudoOrphanErt>_>_>,_std::hash<unsigned_long_long>,_std::equal_to<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::unordered_map<unsigned_long_long,_yactfr::internal::PseudoOrphanErt,_std::hash<unsigned_long_long>,_std::equal_to<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_yactfr::internal::PseudoOrphanErt>_>_>_>_>_>
       ::find(pPVar2,&local_68);
  pPVar2 = PseudoTraceType::pseudoOrphanErts((PseudoTraceType *)pseudoDst->_id);
  __range3 = (unordered_map<unsigned_long_long,_yactfr::internal::PseudoOrphanErt,_std::hash<unsigned_long_long>,_std::equal_to<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_yactfr::internal::PseudoOrphanErt>_>_>
              *)std::
                unordered_map<unsigned_long_long,_std::unordered_map<unsigned_long_long,_yactfr::internal::PseudoOrphanErt,_std::hash<unsigned_long_long>,_std::equal_to<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_yactfr::internal::PseudoOrphanErt>_>_>,_std::hash<unsigned_long_long>,_std::equal_to<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::unordered_map<unsigned_long_long,_yactfr::internal::PseudoOrphanErt,_std::hash<unsigned_long_long>,_std::equal_to<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_yactfr::internal::PseudoOrphanErt>_>_>_>_>_>
                ::end(pPVar2);
  bVar1 = std::__detail::operator!=
                    (&local_60,
                     (_Node_iterator_base<std::pair<const_unsigned_long_long,_std::unordered_map<unsigned_long_long,_yactfr::internal::PseudoOrphanErt,_std::hash<unsigned_long_long>,_std::equal_to<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_yactfr::internal::PseudoOrphanErt>_>_>_>,_false>
                      *)&__range3);
  if (bVar1) {
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_long_long,_std::unordered_map<unsigned_long_long,_yactfr::internal::PseudoOrphanErt,_std::hash<unsigned_long_long>,_std::equal_to<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_yactfr::internal::PseudoOrphanErt>_>_>_>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_unsigned_long_long,_std::unordered_map<unsigned_long_long,_yactfr::internal::PseudoOrphanErt,_std::hash<unsigned_long_long>,_std::equal_to<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_yactfr::internal::PseudoOrphanErt>_>_>_>,_false,_false>
                           *)&local_60);
    __end3 = std::
             unordered_map<unsigned_long_long,_yactfr::internal::PseudoOrphanErt,_std::hash<unsigned_long_long>,_std::equal_to<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_yactfr::internal::PseudoOrphanErt>_>_>
             ::begin(&ppVar3->second);
    ertIdPseudoOrphanErtPair =
         (pair<const_unsigned_long_long,_yactfr::internal::PseudoOrphanErt> *)
         std::
         unordered_map<unsigned_long_long,_yactfr::internal::PseudoOrphanErt,_std::hash<unsigned_long_long>,_std::equal_to<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_yactfr::internal::PseudoOrphanErt>_>_>
         ::end(&ppVar3->second);
    while (bVar1 = std::__detail::operator!=
                             (&__end3.
                               super__Node_iterator_base<std::pair<const_unsigned_long_long,_yactfr::internal::PseudoOrphanErt>,_false>
                              ,(_Node_iterator_base<std::pair<const_unsigned_long_long,_yactfr::internal::PseudoOrphanErt>,_false>
                                *)&ertIdPseudoOrphanErtPair), bVar1) {
      local_a0 = std::__detail::
                 _Node_iterator<std::pair<const_unsigned_long_long,_yactfr::internal::PseudoOrphanErt>,_false,_false>
                 ::operator*(&__end3);
      local_a8 = PseudoOrphanErt::pseudoErt(&local_a0->second);
      pVar6 = std::
              unordered_set<yactfr::internal::PseudoErt_*,_std::hash<yactfr::internal::PseudoErt_*>,_std::equal_to<yactfr::internal::PseudoErt_*>,_std::allocator<yactfr::internal::PseudoErt_*>_>
              ::insert((unordered_set<yactfr::internal::PseudoErt_*,_std::hash<yactfr::internal::PseudoErt_*>,_std::equal_to<yactfr::internal::PseudoErt_*>,_std::allocator<yactfr::internal::PseudoErt_*>_>
                        *)&it,&local_a8);
      ertSet._M_t._M_impl.super__Rb_tree_header._M_node_count =
           (size_t)pVar6.first.super__Node_iterator_base<yactfr::internal::PseudoErt_*,_false>.
                   _M_cur;
      std::__detail::
      _Node_iterator<std::pair<const_unsigned_long_long,_yactfr::internal::PseudoOrphanErt>,_false,_false>
      ::operator++(&__end3);
    }
  }
  PseudoDst::validate((PseudoDst *)in_RDX,(PseudoErtSet *)&it);
  std::
  set<std::unique_ptr<const_yactfr::EventRecordType,_std::default_delete<const_yactfr::EventRecordType>_>,_yactfr::internal::ErtIdComp,_std::allocator<std::unique_ptr<const_yactfr::EventRecordType,_std::default_delete<const_yactfr::EventRecordType>_>_>_>
  ::set((set<std::unique_ptr<const_yactfr::EventRecordType,_std::default_delete<const_yactfr::EventRecordType>_>,_yactfr::internal::ErtIdComp,_std::allocator<std::unique_ptr<const_yactfr::EventRecordType,_std::default_delete<const_yactfr::EventRecordType>_>_>_>
         *)&__range2);
  __end2 = std::
           unordered_set<yactfr::internal::PseudoErt_*,_std::hash<yactfr::internal::PseudoErt_*>,_std::equal_to<yactfr::internal::PseudoErt_*>,_std::allocator<yactfr::internal::PseudoErt_*>_>
           ::begin((unordered_set<yactfr::internal::PseudoErt_*,_std::hash<yactfr::internal::PseudoErt_*>,_std::equal_to<yactfr::internal::PseudoErt_*>,_std::allocator<yactfr::internal::PseudoErt_*>_>
                    *)&it);
  pseudoErt = (PseudoErt *)
              std::
              unordered_set<yactfr::internal::PseudoErt_*,_std::hash<yactfr::internal::PseudoErt_*>,_std::equal_to<yactfr::internal::PseudoErt_*>,_std::allocator<yactfr::internal::PseudoErt_*>_>
              ::end((unordered_set<yactfr::internal::PseudoErt_*,_std::hash<yactfr::internal::PseudoErt_*>,_std::equal_to<yactfr::internal::PseudoErt_*>,_std::allocator<yactfr::internal::PseudoErt_*>_>
                     *)&it);
  while (bVar1 = std::__detail::operator!=
                           (&__end2.super__Node_iterator_base<yactfr::internal::PseudoErt_*,_false>,
                            (_Node_iterator_base<yactfr::internal::PseudoErt_*,_false> *)&pseudoErt)
        , bVar1) {
    ppPVar4 = std::__detail::_Node_iterator<yactfr::internal::PseudoErt_*,_true,_false>::operator*
                        (&__end2);
    local_110._pseudoTraceType = (PseudoTraceType *)*ppPVar4;
    _ertFromPseudoErt(&local_110,(PseudoErt *)pseudoDst,(PseudoDst *)local_110._pseudoTraceType);
    pVar7 = std::
            set<std::unique_ptr<const_yactfr::EventRecordType,_std::default_delete<const_yactfr::EventRecordType>_>,_yactfr::internal::ErtIdComp,_std::allocator<std::unique_ptr<const_yactfr::EventRecordType,_std::default_delete<const_yactfr::EventRecordType>_>_>_>
            ::insert((set<std::unique_ptr<const_yactfr::EventRecordType,_std::default_delete<const_yactfr::EventRecordType>_>,_yactfr::internal::ErtIdComp,_std::allocator<std::unique_ptr<const_yactfr::EventRecordType,_std::default_delete<const_yactfr::EventRecordType>_>_>_>
                      *)&__range2,(value_type *)&local_110);
    local_120 = (_Base_ptr)pVar7.first._M_node;
    local_118 = pVar7.second;
    std::
    unique_ptr<const_yactfr::EventRecordType,_std::default_delete<const_yactfr::EventRecordType>_>::
    ~unique_ptr((unique_ptr<const_yactfr::EventRecordType,_std::default_delete<const_yactfr::EventRecordType>_>
                 *)&local_110);
    std::__detail::_Node_iterator<yactfr::internal::PseudoErt_*,_true,_false>::operator++(&__end2);
  }
  local_130._8_8_ = PseudoDst::id((PseudoDst *)in_RDX);
  args_2 = PseudoDst::ns_abi_cxx11_((PseudoDst *)in_RDX);
  args_3 = PseudoDst::name_abi_cxx11_((PseudoDst *)in_RDX);
  args_4 = (set<std::unique_ptr<const_yactfr::EventRecordType,_std::default_delete<const_yactfr::EventRecordType>_>,_yactfr::internal::ErtIdComp,_std::allocator<std::unique_ptr<const_yactfr::EventRecordType,_std::default_delete<const_yactfr::EventRecordType>_>_>_>
            *)PseudoDst::uid_abi_cxx11_((PseudoDst *)in_RDX);
  pPVar5 = PseudoDst::pseudoPktCtxType((PseudoDst *)in_RDX);
  _scopeStructTypeFromPseudoDt
            ((TraceTypeFromPseudoTraceTypeConverter *)local_130,(PseudoDt *)pseudoDst,(Scope)pPVar5,
             (PseudoDst *)0x1,in_RDX);
  pPVar5 = PseudoDst::pseudoErHeaderType((PseudoDst *)in_RDX);
  _scopeStructTypeFromPseudoDt
            ((TraceTypeFromPseudoTraceTypeConverter *)(local_140 + 8),(PseudoDt *)pseudoDst,
             (Scope)pPVar5,(PseudoDst *)0x2,in_RDX);
  pPVar5 = PseudoDst::pseudoErCommonCtxType((PseudoDst *)in_RDX);
  _scopeStructTypeFromPseudoDt
            ((TraceTypeFromPseudoTraceTypeConverter *)local_140,(PseudoDt *)pseudoDst,(Scope)pPVar5,
             (PseudoDst *)0x3,in_RDX);
  local_148._M_t.
  super__Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>.
  super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl =
       (tuple<const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>)
       PseudoDst::defClkType((PseudoDst *)in_RDX);
  WithAttrsMixin::attrs(&in_RDX->super_WithAttrsMixin);
  tryCloneAttrs((MapItem *)local_150);
  DataStreamType::
  create<unsigned_long_long,boost::optional<std::__cxx11::string>const&,boost::optional<std::__cxx11::string>const&,boost::optional<std::__cxx11::string>const&,std::set<std::unique_ptr<yactfr::EventRecordType_const,std::default_delete<yactfr::EventRecordType_const>>,yactfr::internal::ErtIdComp,std::allocator<std::unique_ptr<yactfr::EventRecordType_const,std::default_delete<yactfr::EventRecordType_const>>>>,std::unique_ptr<yactfr::StructureType_const,std::default_delete<yactfr::StructureType_const>>,std::unique_ptr<yactfr::StructureType_const,std::default_delete<yactfr::StructureType_const>>,std::unique_ptr<yactfr::StructureType_const,std::default_delete<yactfr::StructureType_const>>,yactfr::ClockType_const*,std::unique_ptr<yactfr::MapItem_const,std::default_delete<yactfr::MapItem_const>>>
            ((unsigned_long_long *)this,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)(local_130 + 8),args_2,args_3,args_4,
             (unique_ptr<const_yactfr::StructureType,_std::default_delete<const_yactfr::StructureType>_>
              *)&__range2,
             (unique_ptr<const_yactfr::StructureType,_std::default_delete<const_yactfr::StructureType>_>
              *)local_130,
             (unique_ptr<const_yactfr::StructureType,_std::default_delete<const_yactfr::StructureType>_>
              *)(local_140 + 8),(ClockType **)local_140,
             (unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             &local_148);
  std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
            ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             local_150);
  std::unique_ptr<const_yactfr::StructureType,_std::default_delete<const_yactfr::StructureType>_>::
  ~unique_ptr((unique_ptr<const_yactfr::StructureType,_std::default_delete<const_yactfr::StructureType>_>
               *)local_140);
  std::unique_ptr<const_yactfr::StructureType,_std::default_delete<const_yactfr::StructureType>_>::
  ~unique_ptr((unique_ptr<const_yactfr::StructureType,_std::default_delete<const_yactfr::StructureType>_>
               *)(local_140 + 8));
  std::unique_ptr<const_yactfr::StructureType,_std::default_delete<const_yactfr::StructureType>_>::
  ~unique_ptr((unique_ptr<const_yactfr::StructureType,_std::default_delete<const_yactfr::StructureType>_>
               *)local_130);
  std::
  set<std::unique_ptr<const_yactfr::EventRecordType,_std::default_delete<const_yactfr::EventRecordType>_>,_yactfr::internal::ErtIdComp,_std::allocator<std::unique_ptr<const_yactfr::EventRecordType,_std::default_delete<const_yactfr::EventRecordType>_>_>_>
  ::~set((set<std::unique_ptr<const_yactfr::EventRecordType,_std::default_delete<const_yactfr::EventRecordType>_>,_yactfr::internal::ErtIdComp,_std::allocator<std::unique_ptr<const_yactfr::EventRecordType,_std::default_delete<const_yactfr::EventRecordType>_>_>_>
          *)&__range2);
  std::
  unordered_set<yactfr::internal::PseudoErt_*,_std::hash<yactfr::internal::PseudoErt_*>,_std::equal_to<yactfr::internal::PseudoErt_*>,_std::allocator<yactfr::internal::PseudoErt_*>_>
  ::~unordered_set((unordered_set<yactfr::internal::PseudoErt_*,_std::hash<yactfr::internal::PseudoErt_*>,_std::equal_to<yactfr::internal::PseudoErt_*>,_std::allocator<yactfr::internal::PseudoErt_*>_>
                    *)&it);
  return (__uniq_ptr_data<const_yactfr::DataStreamType,_std::default_delete<const_yactfr::DataStreamType>,_true,_true>
          )(__uniq_ptr_data<const_yactfr::DataStreamType,_std::default_delete<const_yactfr::DataStreamType>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<const DataStreamType> TraceTypeFromPseudoTraceTypeConverter::_dstFromPseudoDst(PseudoDst& pseudoDst)
{
    // collect pseudo child event record types
    PseudoErtSet pseudoErts;
    const auto it = _pseudoTraceType->pseudoOrphanErts().find(pseudoDst.id());

    if (it != _pseudoTraceType->pseudoOrphanErts().end()) {
        for (auto& ertIdPseudoOrphanErtPair : it->second) {
            pseudoErts.insert(&ertIdPseudoOrphanErtPair.second.pseudoErt());
        }
    }

    // validate pseudo data stream type before converting
    pseudoDst.validate(pseudoErts);

    // convert pseudo event record types
    EventRecordTypeSet ertSet;

    for (auto pseudoErt : pseudoErts) {
        ertSet.insert(this->_ertFromPseudoErt(*pseudoErt, pseudoDst));
    }

    // create yactfr data stream type
    return DataStreamType::create(pseudoDst.id(), pseudoDst.ns(), pseudoDst.name(),
                                  pseudoDst.uid(), std::move(ertSet),
                                  this->_scopeStructTypeFromPseudoDt(pseudoDst.pseudoPktCtxType(),
                                                                     Scope::PacketContext,
                                                                     &pseudoDst),
                                  this->_scopeStructTypeFromPseudoDt(pseudoDst.pseudoErHeaderType(),
                                                                     Scope::EventRecordHeader,
                                                                     &pseudoDst),
                                  this->_scopeStructTypeFromPseudoDt(pseudoDst.pseudoErCommonCtxType(),
                                                                     Scope::EventRecordCommonContext,
                                                                     &pseudoDst),
                                  pseudoDst.defClkType(), tryCloneAttrs(pseudoDst.attrs()));
}